

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_json.cc
# Opt level: O0

void __thiscall QPDF::createFromJSON(QPDF *this,shared_ptr<InputSource> *is)

{
  char *buf;
  element_type *peVar1;
  char *description;
  size_t length;
  shared_ptr<InputSource> local_28;
  shared_ptr<InputSource> *local_18;
  shared_ptr<InputSource> *is_local;
  QPDF *this_local;
  
  local_18 = is;
  is_local = (shared_ptr<InputSource> *)this;
  peVar1 = std::__shared_ptr_access<InputSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<InputSource,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      is);
  (*peVar1->_vptr_InputSource[3])();
  description = (char *)std::__cxx11::string::c_str();
  buf = JSON_PDF;
  length = strlen(JSON_PDF);
  processMemoryFile(this,description,buf,length,(char *)0x0);
  std::shared_ptr<InputSource>::shared_ptr(&local_28,is);
  importJSON(this,&local_28,true);
  std::shared_ptr<InputSource>::~shared_ptr(&local_28);
  return;
}

Assistant:

void
QPDF::createFromJSON(std::shared_ptr<InputSource> is)
{
    processMemoryFile(is->getName().c_str(), JSON_PDF, strlen(JSON_PDF));
    importJSON(is, true);
}